

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2BufferSharingTest::renderResource
          (GLES2BufferSharingTest *this,Surface *screen,Surface *reference)

{
  unsigned_short uVar1;
  byte bVar2;
  glReadPixelsFunc p_Var3;
  pointer puVar4;
  bool bVar5;
  float fVar6;
  Surface *pSVar7;
  int iVar8;
  GLenum GVar9;
  GLuint GVar10;
  GLuint GVar11;
  TestError *pTVar12;
  GLsizei GVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  void *pvVar20;
  int iVar21;
  unsigned_short uVar22;
  long lVar23;
  GLES2BufferSharingTest *pGVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float xf;
  float fVar32;
  float fVar33;
  vector<float,_std::allocator<float>_> coords;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  ProgramSources sources;
  ShaderProgram program;
  value_type local_268;
  value_type local_248;
  GLES2BufferSharingTest *local_220;
  undefined1 local_218 [16];
  Surface *local_200;
  undefined1 local_1f8 [16];
  IVec4 local_1e0;
  ProgramSources local_1d0;
  ShaderProgram local_100;
  
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_220 = this;
  local_200 = screen;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,
             "attribute mediump vec2 a_pos;\nattribute mediump float a_color;\nvarying mediump float v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
             ,"");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "varying mediump float v_color;\nvoid main(void)\n{\n\tgl_FragColor = vec4(v_color, v_color, v_color, 1.0);\n}\n"
             ,"");
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_1d0._193_8_ = 0;
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_1d0,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d0.sources,&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d0.sources + 1,&local_268);
  glu::ShaderProgram::ShaderProgram(&local_100,&(local_220->super_GLES2SharingTest).m_gl,&local_1d0)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1d0.attribLocationBindings);
  lVar23 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_1d0.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  pGVar24 = local_220;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x168);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_248._M_dataplus._M_p = (pointer)0x0;
  local_248._M_string_length = 0;
  uVar25 = 0;
  local_248.field_2._M_allocated_capacity = 0;
  local_268.field_2._M_allocated_capacity = 0;
  local_268._M_dataplus._M_p = (pointer)0x0;
  local_268._M_string_length = 0;
  if (3 < *(int *)&(pGVar24->m_buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&(pGVar24->m_buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    uVar22 = 0;
    do {
      if (local_248._M_string_length == local_248.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar22;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_248,
                   (iterator)local_248._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_248._M_string_length = uVar22;
        local_248._M_string_length = local_248._M_string_length + 2;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar22 + 1;
      if (local_248._M_string_length == local_248.field_2._M_allocated_capacity) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_248,
                   (iterator)local_248._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_248._M_string_length =
             (unsigned_short)
             local_1d0.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_248._M_string_length = local_248._M_string_length + 2;
      }
      uVar1 = uVar22 + 2;
      if (local_248._M_string_length == local_248.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar1;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_248,
                   (iterator)local_248._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_248._M_string_length = uVar1;
        local_248._M_string_length = local_248._M_string_length + 2;
      }
      if (local_248._M_string_length == local_248.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar1;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_248,
                   (iterator)local_248._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_248._M_string_length = uVar1;
        local_248._M_string_length = local_248._M_string_length + 2;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar22 + 3;
      if (local_248._M_string_length == local_248.field_2._M_allocated_capacity) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_248,
                   (iterator)local_248._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_248._M_string_length =
             (unsigned_short)
             local_1d0.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_248._M_string_length = local_248._M_string_length + 2;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (float)CONCAT22(local_1d0.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._2_2_,uVar22);
      if (local_248._M_string_length == local_248.field_2._M_allocated_capacity) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_248,
                   (iterator)local_248._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_248._M_string_length = uVar22;
        local_248._M_string_length = local_248._M_string_length + 2;
      }
      fVar28 = (float)(uVar25 & 0xf) * 0.125 + -1.0;
      if (local_268._M_string_length == local_268.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar28;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_268,
                   (iterator)local_268._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_268._M_string_length = fVar28;
        local_268._M_string_length = local_268._M_string_length + 4;
      }
      local_218 = ZEXT416((uint)((float)(int)uVar25 * 0.0625));
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (float)(int)((float)(int)uVar25 * 0.0625) * 0.125 + -1.0;
      local_1f8 = ZEXT416((uint)local_1d0.sources[0].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (local_268._M_string_length == local_268.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_268,
                   (iterator)local_268._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_268._M_string_length =
             local_1d0.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_4_;
        local_268._M_string_length = local_268._M_string_length + 4;
      }
      if (local_268._M_string_length == local_268.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar28;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_268,
                   (iterator)local_268._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_268._M_string_length = fVar28;
        local_268._M_string_length = local_268._M_string_length + 4;
      }
      fVar28 = (float)((int)(float)local_218._0_4_ + 1) * 0.125 + -1.0;
      if (local_268._M_string_length == local_268.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar28;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_268,
                   (iterator)local_268._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_268._M_string_length = fVar28;
        local_268._M_string_length = local_268._M_string_length + 4;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (float)((uVar25 & 0xf) + 1) * 0.125 + -1.0;
      local_218._0_4_ =
           local_1d0.sources[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_4_;
      if (local_268._M_string_length == local_268.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_268,
                   (iterator)local_268._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_268._M_string_length =
             local_1d0.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_4_;
        local_268._M_string_length = local_268._M_string_length + 4;
      }
      pGVar24 = local_220;
      if (local_268._M_string_length == local_268.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar28;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_268,
                   (iterator)local_268._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_268._M_string_length = fVar28;
        local_268._M_string_length = local_268._M_string_length + 4;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (float)local_218._0_4_;
      if (local_268._M_string_length == local_268.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_268,
                   (iterator)local_268._M_string_length,(float *)&local_1d0);
      }
      else {
        *(undefined4 *)local_268._M_string_length = local_218._0_4_;
        local_268._M_string_length = local_268._M_string_length + 4;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (float)local_1f8._0_4_;
      if (local_268._M_string_length == local_268.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_268,
                   (iterator)local_268._M_string_length,(float *)&local_1d0);
      }
      else {
        *(undefined4 *)local_268._M_string_length = local_1f8._0_4_;
        local_268._M_string_length = local_268._M_string_length + 4;
      }
      uVar25 = uVar25 + 1;
      iVar8 = *(int *)&(pGVar24->m_buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
              *(int *)&(pGVar24->m_buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      iVar15 = iVar8 + 3;
      if (-1 < iVar8) {
        iVar15 = iVar8;
      }
      uVar22 = uVar22 + 4;
    } while ((int)uVar25 < iVar15 >> 2);
  }
  pSVar7 = local_200;
  if (local_200 == (Surface *)0x0) {
    GVar13 = 0xf0;
    iVar15 = 0xf0;
  }
  else {
    iVar15 = local_200->m_width;
    GVar13 = local_200->m_height;
  }
  (*(pGVar24->super_GLES2SharingTest).m_gl.viewport)(0,0,iVar15,GVar13);
  GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"viewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x18e);
  (*(pGVar24->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
  GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,400);
  (*(pGVar24->super_GLES2SharingTest).m_gl.clear)(0x4000);
  GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x191);
  (*(pGVar24->super_GLES2SharingTest).m_gl.useProgram)(local_100.m_program.m_program);
  GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x193);
  GVar10 = (*(pGVar24->super_GLES2SharingTest).m_gl.getAttribLocation)
                     (local_100.m_program.m_program,"a_pos");
  GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x196);
  if (GVar10 != 0xffffffff) {
    GVar11 = (*(pGVar24->super_GLES2SharingTest).m_gl.getAttribLocation)
                       (local_100.m_program.m_program,"a_color");
    GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar9,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x19a);
    if (GVar11 != 0xffffffff) {
      (*(pGVar24->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar11);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"enableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x19d);
      (*(pGVar24->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar10);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"enableVertexAttribArray(gridLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x19e);
      (*(pGVar24->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,pGVar24->m_glBuffer);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"bindBuffer(GL_ARRAY_BUFFER, m_glBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a0);
      (*(pGVar24->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar11,1,0x1401,'\x01',0,(void *)0x0);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,
                      "vertexAttribPointer(colorLocation, 1, GL_UNSIGNED_BYTE, GL_TRUE, 0, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a1);
      (*(pGVar24->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,0);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a2);
      (*(pGVar24->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar10,2,0x1406,'\0',0,local_268._M_dataplus._M_p);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,
                      "vertexAttribPointer(gridLocation, 2, GL_FLOAT, GL_FALSE, 0, &(coords[0]))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a4);
      (*(pGVar24->super_GLES2SharingTest).m_gl.drawElements)
                (4,(GLsizei)(local_248._M_string_length - (long)local_248._M_dataplus._M_p >> 1),
                 0x1403,local_248._M_dataplus._M_p);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,
                      "drawElements(GL_TRIANGLES, (GLsizei)indices.size(), GL_UNSIGNED_SHORT, &(indices[0]))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a6);
      (*(pGVar24->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar11);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"disableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a7);
      (*(pGVar24->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar10);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"disableVertexAttribArray(gridLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a8);
      (*(pGVar24->super_GLES2SharingTest).m_gl.useProgram)(0);
      GVar9 = (*(pGVar24->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"useProgram(0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1aa);
      if (pSVar7 != (Surface *)0x0) {
        local_1e0.m_data[0] = RGBA;
        local_1e0.m_data[1] = UNORM_INT8;
        pvVar20 = (void *)(reference->m_pixels).m_cap;
        if (pvVar20 != (void *)0x0) {
          pvVar20 = (reference->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_1d0,(TextureFormat *)&local_1e0,reference->m_width,
                   reference->m_height,1,pvVar20);
        local_1e0.m_data[0] = 0xff;
        local_1e0.m_data[1] = SNORM_INT8;
        local_1e0.m_data[2] = 0;
        local_1e0.m_data[3] = 0xff;
        tcu::clear((PixelBufferAccess *)&local_1d0,&local_1e0);
        p_Var3 = (local_220->super_GLES2SharingTest).m_gl.readPixels;
        iVar8 = local_200->m_width;
        iVar14 = local_200->m_height;
        local_1e0.m_data[0] = RGBA;
        local_1e0.m_data[1] = UNORM_INT8;
        pvVar20 = (void *)(local_200->m_pixels).m_cap;
        if (pvVar20 != (void *)0x0) {
          pvVar20 = (local_200->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_1d0,(TextureFormat *)&local_1e0,iVar8,iVar14,1,
                   pvVar20);
        (*p_Var3)(0,0,iVar8,iVar14,0x1908,0x1401,
                  local_1d0.sources[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
        puVar4 = (local_220->m_buffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar14 = *(int *)&(local_220->m_buffer).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (int)puVar4;
        iVar8 = iVar14 + 3;
        if (-1 < iVar14) {
          iVar8 = iVar14;
        }
        local_1f8._0_4_ = iVar8;
        if (3 < iVar14) {
          fVar28 = (float)iVar15;
          local_1f8._0_4_ = iVar8 >> 2;
          uVar25 = -(uint)(fVar28 * 0.5 < 0.0);
          fVar31 = (float)GVar13;
          local_220 = (GLES2BufferSharingTest *)CONCAT44(local_220._4_4_,fVar31);
          uVar27 = -(uint)(fVar31 * 0.5 < 0.0);
          fVar29 = (float)(int)((float)(~uVar25 & 0x3f000000 | uVar25 & 0xbf000000) + fVar28 * 0.5);
          fVar30 = (float)(int)((float)(~uVar27 & 0x3f000000 | uVar27 & 0xbf000000) + fVar31 * 0.5);
          uVar16 = 0;
          do {
            uVar25 = (uint)uVar16;
            local_218._0_8_ = uVar16;
            fVar32 = ((float)(uVar25 & 0xf) * 0.125 + -1.0) * fVar28 * 0.5 + fVar29;
            uVar27 = -(uint)(fVar32 < 0.0);
            iVar15 = (int)((float)(~uVar27 & 0x3f000000 | uVar27 & 0xbf000000) + fVar32);
            fVar32 = ((float)((uVar25 & 0xf) + 1) * 0.125 + -1.0) * fVar28 * 0.5 + fVar29;
            uVar27 = -(uint)(fVar32 < 0.0);
            iVar14 = (int)((float)(~uVar27 & 0x3f000000 | uVar27 & 0xbf000000) + fVar32);
            if (iVar14 - iVar15 != 0 && iVar15 <= iVar14) {
              fVar32 = ((float)(int)((float)(int)uVar25 * 0.0625) * 0.125 + -1.0) * fVar31 * 0.5 +
                       fVar30;
              uVar27 = -(uint)(fVar32 < 0.0);
              iVar18 = (int)((float)(~uVar27 & 0x3f000000 | uVar27 & 0xbf000000) + fVar32);
              fVar32 = ((float)((int)((float)(int)uVar25 * 0.0625) + 1) * 0.125 + -1.0) * fVar31 *
                       0.5 + fVar30;
              uVar27 = -(uint)(fVar32 < 0.0);
              iVar19 = (int)((float)(~uVar27 & 0x3f000000 | uVar27 & 0xbf000000) + fVar32);
              iVar21 = iVar19 - iVar18;
              iVar17 = iVar15;
              do {
                if (iVar18 < iVar19) {
                  fVar32 = ((float)(iVar17 - iVar15) + 0.5) / (float)(iVar14 - iVar15);
                  pvVar20 = (reference->m_pixels).m_ptr;
                  iVar26 = 0;
                  do {
                    fVar33 = ((float)iVar26 + 0.5) / (float)iVar21;
                    bVar5 = fVar33 < fVar32;
                    fVar6 = 1.0 - fVar32;
                    if (!bVar5) {
                      fVar33 = 1.0 - fVar33;
                      fVar6 = fVar32;
                    }
                    uVar27 = (uint)bVar5 * 2 | uVar25 * 4;
                    bVar2 = puVar4[(int)(uVar27 | 1)];
                    *(uint *)((long)pvVar20 +
                             (long)((iVar18 + iVar26) * reference->m_width + iVar17) * 4) =
                         ((int)((float)(int)((uint)puVar4[(int)uVar27] - (uint)bVar2) * fVar33 +
                               (float)(int)((uint)puVar4[(int)(uVar25 * 4 + (uint)!bVar5 * 2)] -
                                           (uint)bVar2) * fVar6 + (float)bVar2) & 0xffU) * 0x10101 |
                         0xff000000;
                    iVar26 = iVar26 + 1;
                  } while (iVar21 != iVar26);
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 != iVar14);
            }
            uVar16 = (ulong)(uVar25 + 1);
          } while (uVar25 + 1 != iVar8 >> 2);
        }
      }
      if (local_268._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_268._M_dataplus._M_p,
                        local_268.field_2._M_allocated_capacity - (long)local_268._M_dataplus._M_p);
      }
      if (local_248._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_248._M_dataplus._M_p,
                        local_248.field_2._M_allocated_capacity - (long)local_248._M_dataplus._M_p);
      }
      glu::ShaderProgram::~ShaderProgram(&local_100);
      return;
    }
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,(char *)0x0,"colorLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x19b);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar12,(char *)0x0,"gridLocation != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x197);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2BufferSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump float a_color;\n"
	"varying mediump float v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump float v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = vec4(v_color, v_color, v_color, 1.0);\n"
	"}\n";

	glu::ShaderProgram program(m_gl, glu::makeVtxFragSources(vertexShader, fragmentShader));

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	std::vector<deUint16>	indices;
	std::vector<float>		coords;

	DE_ASSERT(m_buffer.size() % 4 == 0);

	for (int i = 0; i < (int)m_buffer.size() / 4; i++)
	{
		indices.push_back((deUint16)(i*4));
		indices.push_back((deUint16)(i*4 + 1));
		indices.push_back((deUint16)(i*4 + 2));
		indices.push_back((deUint16)(i*4 + 2));
		indices.push_back((deUint16)(i*4 + 3));
		indices.push_back((deUint16)(i*4));

		coords.push_back(0.125f * (float)(i % 16) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f)) - 1.0f);

		coords.push_back(0.125f * (float)(i % 16) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f);

		coords.push_back(0.125f * (float)((i % 16) + 1) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f);

		coords.push_back(0.125f * (float)((i % 16) + 1) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f)) - 1.0f);
	}

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	GLuint gridLocation = m_gl.getAttribLocation(program.getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(gridLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(program.getProgram(), "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(gridLocation));

	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_glBuffer));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 1, GL_UNSIGNED_BYTE, GL_TRUE, 0, DE_NULL));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, 0));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(gridLocation, 2, GL_FLOAT, GL_FALSE, 0, &(coords[0])));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, (GLsizei)indices.size(), GL_UNSIGNED_SHORT, &(indices[0])));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(gridLocation));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());
		for (int i = 0; i < (int)m_buffer.size() / 4; i++)
		{
			float fx1 = 0.125f * (float)(i % 16) - 1.0f;
			float fy1 = 0.125f * (float)((int)((float)i / 16.0f)) - 1.0f;
			float fx2 = 0.125f * (float)((i % 16) + 1) - 1.0f;
			float fy2 = 0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f;

			int ox = deRoundFloatToInt32((float)width	/ 2.0f);
			int oy = deRoundFloatToInt32((float)height	/ 2.0f);
			int x1 = deRoundFloatToInt32(((float)width	 * fx1 / 2.0f) + (float)ox);
			int y1 = deRoundFloatToInt32(((float)height	 * fy1 / 2.0f) + (float)oy);
			int x2 = deRoundFloatToInt32(((float)width	 * fx2 / 2.0f) + (float)ox);
			int y2 = deRoundFloatToInt32(((float)height	 * fy2 / 2.0f) + (float)oy);

			for (int x = x1; x < x2; x++)
			{
				for (int y = y1; y < y2; y++)
				{
					float		xf		= ((float)(x-x1) + 0.5f) / (float)(x2 - x1);
					float		yf		= ((float)(y-y1) + 0.5f) / (float)(y2 - y1);
					bool		tri		= yf >= xf;
					deUint8		a		= m_buffer[i*4 + (tri ? 1 : 3)];
					deUint8		b		= m_buffer[i*4 + (tri ? 2 : 0)];
					deUint8		c		= m_buffer[i*4 + (tri ? 0 : 2)];
					float		s		= tri ? xf : 1.0f-xf;
					float		t		= tri ? 1.0f-yf : yf;
					float		val		= (float)a + (float)(b-a)*s + (float)(c-a)*t;

					reference->setPixel(x, y, tcu::RGBA((deUint8)val, (deUint8)val, (deUint8)val, 255));
				}
			}
		}
	}
}